

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_three_reg_same_fp16(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uint uVar2;
  TCGv_ptr arg3;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  uint srcidx;
  uint srcidx_00;
  uint srcidx_01;
  uint uVar6;
  uint uVar7;
  uintptr_t o;
  int line;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uintptr_t o_1;
  TCGv_i32 tcg_res [8];
  
  if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) {
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = fp_access_check(s);
  if (!_Var1) {
    return;
  }
  srcidx = insn >> 0x10 & 0x1f;
  srcidx_00 = insn >> 5 & 0x1f;
  srcidx_01 = insn & 0x1f;
  uVar10 = insn >> 0x14 & 8 | insn >> 0xb & 7;
  uVar6 = insn >> 0x19 & 0x10;
  uVar8 = insn >> 0x1c & 4;
  uVar7 = (uVar6 + uVar10) - 0x10;
  uVar2 = uVar7 >> 1;
  uVar7 = uVar2 | (uint)((uVar7 & 1) != 0) << 0x1f;
  uVar9 = uVar8 + 4;
  arg3 = get_fpstatus_ptr_aarch64(tcg_ctx,true);
  if ((uVar7 < 8 & 0x9bU >> ((byte)uVar2 & 0x1f)) == 0) {
    uVar11 = (ulong)(uVar10 | uVar6);
    for (uVar2 = 0; uVar9 != uVar2; uVar2 = uVar2 + 1) {
      pTVar3 = tcg_temp_new_i32(tcg_ctx);
      pTVar4 = tcg_temp_new_i32(tcg_ctx);
      pTVar5 = tcg_temp_new_i32(tcg_ctx);
      read_vec_element_i32(s,pTVar3,srcidx_00,uVar2,MO_16);
      read_vec_element_i32(s,pTVar4,srcidx,uVar2,MO_16);
      switch(uVar11) {
      case 0:
        gen_helper_advsimd_maxnumh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 1:
        read_vec_element_i32(s,pTVar5,srcidx_01,uVar2,MO_16);
        goto LAB_0063be8d;
      case 2:
        gen_helper_advsimd_addh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 3:
        gen_helper_advsimd_mulxh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 4:
        gen_helper_advsimd_ceq_f16(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      default:
        fprintf(_stderr,"%s: insn %#04x, fpop %#2x @ %#lx\n","disas_simd_three_reg_same_fp16",
                (ulong)insn,uVar11,s->pc_curr);
        line = 0x2ec7;
        goto LAB_0063c03a;
      case 6:
        gen_helper_advsimd_maxh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 7:
        gen_helper_recpsf_f16(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 8:
        gen_helper_advsimd_minnumh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 9:
        tcg_gen_xori_i32_aarch64(tcg_ctx,pTVar3,pTVar3,0x8000);
        read_vec_element_i32(s,pTVar5,srcidx_01,uVar2,MO_16);
LAB_0063be8d:
        gen_helper_advsimd_muladdh(tcg_ctx,pTVar5,pTVar3,pTVar4,pTVar5,arg3);
        break;
      case 10:
        gen_helper_advsimd_subh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0xe:
        gen_helper_advsimd_minh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0xf:
        gen_helper_rsqrtsf_f16(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0x13:
        gen_helper_advsimd_mulh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0x14:
        gen_helper_advsimd_cge_f16(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0x15:
        gen_helper_advsimd_acge_f16(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0x17:
        gen_helper_advsimd_divh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0x1a:
        gen_helper_advsimd_subh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar5,pTVar5,0x7fff);
        break;
      case 0x1c:
        gen_helper_advsimd_cgt_f16(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 0x1d:
        gen_helper_advsimd_acgt_f16(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
      }
      write_vec_element_i32(s,pTVar5,srcidx_01,uVar2,MO_16);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    }
  }
  else {
    pTVar3 = tcg_temp_new_i32(tcg_ctx);
    pTVar4 = tcg_temp_new_i32(tcg_ctx);
    uVar2 = 0;
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      uVar6 = srcidx;
      if (uVar11 < uVar9 >> 1) {
        uVar6 = srcidx_00;
      }
      uVar10 = uVar2 & uVar8 + 3;
      read_vec_element_i32(s,pTVar3,uVar6,uVar10,MO_16);
      read_vec_element_i32(s,pTVar4,uVar6,uVar10 | 1,MO_16);
      pTVar5 = tcg_temp_new_i32(tcg_ctx);
      tcg_res[uVar11] = pTVar5;
      switch(uVar7) {
      case 0:
        gen_helper_advsimd_maxnumh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 1:
        gen_helper_advsimd_addh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      default:
        line = 0x2e6e;
LAB_0063c03a:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,line,(char *)0x0);
      case 3:
        gen_helper_advsimd_maxh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 4:
        gen_helper_advsimd_minnumh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
        break;
      case 7:
        gen_helper_advsimd_minh(tcg_ctx,pTVar5,pTVar3,pTVar4,arg3);
      }
      uVar2 = uVar2 + 2;
    }
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      pTVar5 = tcg_res[uVar11];
      write_vec_element_i32(s,pTVar5,srcidx_01,(int)uVar11,MO_16);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
  clear_vec_high(s,(_Bool)((byte)(insn >> 0x1e) & 1),srcidx_01);
  return;
}

Assistant:

static void disas_simd_three_reg_same_fp16(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode, fpopcode;
    int is_q, u, a, rm, rn, rd;
    int datasize, elements;
    int pass;
    TCGv_ptr fpst;
    bool pairwise = false;

    if (!dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* For these floating point ops, the U, a and opcode bits
     * together indicate the operation.
     */
    opcode = extract32(insn, 11, 3);
    u = extract32(insn, 29, 1);
    a = extract32(insn, 23, 1);
    is_q = extract32(insn, 30, 1);
    rm = extract32(insn, 16, 5);
    rn = extract32(insn, 5, 5);
    rd = extract32(insn, 0, 5);

    fpopcode = opcode | (a << 3) |  (u << 4);
    datasize = is_q ? 128 : 64;
    elements = datasize / 16;

    switch (fpopcode) {
    case 0x10: /* FMAXNMP */
    case 0x12: /* FADDP */
    case 0x16: /* FMAXP */
    case 0x18: /* FMINNMP */
    case 0x1e: /* FMINP */
        pairwise = true;
        break;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, true);

    if (pairwise) {
        int maxpass = is_q ? 8 : 4;
        TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res[8];

        for (pass = 0; pass < maxpass; pass++) {
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (pass << 1) & (maxpass - 1);

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_16);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_16);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (fpopcode) {
            case 0x10: /* FMAXNMP */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x12: /* FADDP */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x16: /* FMAXP */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x18: /* FMINNMP */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x1e: /* FMINP */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_op1);
        tcg_temp_free_i32(tcg_ctx, tcg_op2);

    } else {
        for (pass = 0; pass < elements; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op1, rn, pass, MO_16);
            read_vec_element_i32(s, tcg_op2, rm, pass, MO_16);

            switch (fpopcode) {
            case 0x0: /* FMAXNM */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0x2: /* FADD */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x3: /* FMULX */
                gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x4: /* FCMEQ */
                gen_helper_advsimd_ceq_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x6: /* FMAX */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x7: /* FRECPS */
                gen_helper_recpsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x8: /* FMINNM */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x9: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                tcg_gen_xori_i32(tcg_ctx, tcg_op1, tcg_op1, 0x8000);
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0xa: /* FSUB */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xe: /* FMIN */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xf: /* FRSQRTS */
                gen_helper_rsqrtsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x13: /* FMUL */
                gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x14: /* FCMGE */
                gen_helper_advsimd_cge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x15: /* FACGE */
                gen_helper_advsimd_acge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x17: /* FDIV */
                gen_helper_advsimd_divh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1a: /* FABD */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                tcg_gen_andi_i32(tcg_ctx, tcg_res, tcg_res, 0x7fff);
                break;
            case 0x1c: /* FCMGT */
                gen_helper_advsimd_cgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1d: /* FACGT */
                gen_helper_advsimd_acgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            default:
                fprintf(stderr, "%s: insn %#04x, fpop %#2x @ %#" PRIx64 "\n",
                        __func__, insn, fpopcode, s->pc_curr);
                g_assert_not_reached();
            }

            write_vec_element_i32(s, tcg_res, rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }
    }

    tcg_temp_free_ptr(tcg_ctx, fpst);

    clear_vec_high(s, is_q, rd);
}